

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NeuralNetworkPreprocessing::SerializeWithCachedSizes
          (NeuralNetworkPreprocessing *this,CodedOutputStream *output)

{
  bool bVar1;
  int size;
  long lVar2;
  char *data;
  string *value;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  NeuralNetworkPreprocessing *this_local;
  
  featurename_abi_cxx11_(this);
  lVar2 = std::__cxx11::string::size();
  if (lVar2 != 0) {
    featurename_abi_cxx11_(this);
    data = (char *)std::__cxx11::string::data();
    featurename_abi_cxx11_(this);
    size = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (data,size,SERIALIZE,"CoreML.Specification.NeuralNetworkPreprocessing.featureName");
    value = featurename_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(1,value,output);
  }
  bVar1 = has_scaler(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (10,&((this->preprocessor_).scaler_)->super_MessageLite,output);
  }
  bVar1 = has_meanimage(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0xb,&((this->preprocessor_).scaler_)->super_MessageLite,output);
  }
  return;
}

Assistant:

void NeuralNetworkPreprocessing::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.NeuralNetworkPreprocessing)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // string featureName = 1;
  if (this->featurename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->featurename().data(), this->featurename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.NeuralNetworkPreprocessing.featureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      1, this->featurename(), output);
  }

  // .CoreML.Specification.NeuralNetworkImageScaler scaler = 10;
  if (has_scaler()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      10, *preprocessor_.scaler_, output);
  }

  // .CoreML.Specification.NeuralNetworkMeanImage meanImage = 11;
  if (has_meanimage()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      11, *preprocessor_.meanimage_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.NeuralNetworkPreprocessing)
}